

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall Model::load_texture(Model *this,string *filename,string *suffix,TGAImage *img)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  char *pcVar4;
  string texfile;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  lVar2 = std::__cxx11::string::find_last_of((char *)filename,0x1065df);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)filename);
    std::operator+(&texfile,&local_40,suffix);
    std::__cxx11::string::~string((string *)&local_40);
    poVar3 = std::operator<<((ostream *)&std::cerr,"texture file ");
    poVar3 = std::operator<<(poVar3,(string *)&texfile);
    poVar3 = std::operator<<(poVar3," loading ");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,texfile._M_dataplus._M_p,(allocator<char> *)&local_40);
    bVar1 = TGAImage::read_tga_file(img,&local_60);
    pcVar4 = "failed";
    if (bVar1) {
      pcVar4 = "ok";
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_60);
    TGAImage::flip_vertically(img);
    std::__cxx11::string::~string((string *)&texfile);
  }
  return;
}

Assistant:

void Model::load_texture(std::string filename, const std::string suffix, TGAImage &img)
{
    size_t dot = filename.find_last_of(".");
    if (dot == std::string::npos) return;
    std::string texfile = filename.substr(0, dot) + suffix;
    std::cerr << "texture file " << texfile << " loading "
              << (img.read_tga_file(texfile.c_str()) ? "ok" : "failed") << std::endl;
    img.flip_vertically();
}